

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::CharClassBuilder::RemoveAbove(CharClassBuilder *this,Rune r)

{
  bool bVar1;
  reference pRVar2;
  RuneRange local_38;
  RuneRange rr;
  RuneRange local_28;
  _Self local_20;
  iterator it;
  Rune r_local;
  CharClassBuilder *this_local;
  
  if (r < 0x10ffff) {
    if (r < 0x7a) {
      if (r < 0x61) {
        this->lower_ = 0;
      }
      else {
        this->lower_ = 0x3ffffffU >> (0x7aU - (char)r & 0x1f) & this->lower_;
      }
    }
    it._M_node._4_4_ = r;
    if (r < 0x5a) {
      if (r < 0x41) {
        this->upper_ = 0;
      }
      else {
        this->upper_ = 0x3ffffffU >> (0x5aU - (char)r & 0x1f) & this->upper_;
      }
    }
    while( true ) {
      RuneRange::RuneRange(&local_28,it._M_node._4_4_ + 1,0x10ffff);
      local_20._M_node =
           (_Base_ptr)
           std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                     (&this->ranges_,&local_28);
      rr = (RuneRange)end(this);
      bVar1 = std::operator==(&local_20,(_Self *)&rr);
      if (bVar1) break;
      pRVar2 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator*(&local_20);
      local_38 = *pRVar2;
      std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>::erase_abi_cxx11_
                ((set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>> *)
                 &this->ranges_,(const_iterator)local_20._M_node);
      this->nrunes_ = this->nrunes_ - ((local_38.hi - local_38.lo) + 1);
      if (local_38.lo <= it._M_node._4_4_) {
        local_38.hi = it._M_node._4_4_;
        std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::insert
                  (&this->ranges_,&local_38);
        this->nrunes_ = (local_38.hi - local_38.lo) + 1 + this->nrunes_;
      }
    }
  }
  return;
}

Assistant:

void CharClassBuilder::RemoveAbove(Rune r) {
  if (r >= Runemax)
    return;

  if (r < 'z') {
    if (r < 'a')
      lower_ = 0;
    else
      lower_ &= AlphaMask >> ('z' - r);
  }

  if (r < 'Z') {
    if (r < 'A')
      upper_ = 0;
    else
      upper_ &= AlphaMask >> ('Z' - r);
  }

  for (;;) {

    iterator it = ranges_.find(RuneRange(r + 1, Runemax));
    if (it == end())
      break;
    RuneRange rr = *it;
    ranges_.erase(it);
    nrunes_ -= rr.hi - rr.lo + 1;
    if (rr.lo <= r) {
      rr.hi = r;
      ranges_.insert(rr);
      nrunes_ += rr.hi - rr.lo + 1;
    }
  }
}